

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::btran(Base *this,DVector *vec)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  pointer pNVar4;
  size_type __n;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *in_RDI;
  const_iterator it;
  double d;
  size_t i_1;
  size_t i;
  DVector w;
  DVector *in_stack_ffffffffffffff38;
  DVector *in_stack_ffffffffffffff40;
  __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  *in_stack_ffffffffffffff48;
  DVector *in_stack_ffffffffffffff50;
  __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_58;
  DVector *local_50;
  size_type local_48;
  pointer local_30;
  
  DVector::DVector(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  for (local_30 = (pointer)0x0;
      local_30 <
      in_RDI[2].super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
      super__Vector_impl_data._M_start;
      local_30 = (pointer)((long)&(local_30->eta).values.
                                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          + 1)) {
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
               in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    dVar1 = *pdVar3;
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    *pdVar3 = dVar1;
  }
  local_48 = std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::size(in_RDI);
  while (__n = local_48 - 1, local_48 != 0) {
    local_50 = (DVector *)0x0;
    local_48 = __n;
    std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[](in_RDI,__n);
    local_58._M_current = (Nonzero *)SVector::cbegin((SVector *)in_stack_ffffffffffffff38);
    while( true ) {
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
                (in_RDI,local_48);
      SVector::cend((SVector *)in_stack_ffffffffffffff38);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar2) break;
      in_stack_ffffffffffffff48 = &local_58;
      pNVar4 = __gnu_cxx::
               __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
               ::operator->(in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = (DVector *)pNVar4->value;
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator->(in_stack_ffffffffffffff48);
      pdVar3 = DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
      local_50 = (DVector *)((double)in_stack_ffffffffffffff50 * *pdVar3 + (double)local_50);
      __gnu_cxx::
      __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator++(&local_58);
    }
    in_stack_ffffffffffffff38 = local_50;
    std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
              (in_RDI,local_48);
    in_stack_ffffffffffffff40 =
         (DVector *)DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48)
    ;
    (in_stack_ffffffffffffff40->vals)._M_size = (size_t)in_stack_ffffffffffffff38;
  }
  local_48 = __n;
  DVector::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  DVector::~DVector((DVector *)0x1e44e4);
  return;
}

Assistant:

void Base::btran(DVector &vec) const {
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[i] = vec[row_ordering[i]];

  for (size_t i = etms.size(); i-- > 0;) {
    double d = 0.0;
    for (auto it = etms[i].eta.cbegin(); it != etms[i].eta.cend(); ++it)
      d += it->value * w[it->index];
    w[etms[i].col] = d;
  }

  vec = w;
}